

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O3

void __thiscall soplex::DataArray<soplex::SPxId>::reSize(DataArray<soplex::SPxId> *this,int newsize)

{
  if (this->themax < newsize) {
    reMax(this,(int)((double)newsize * this->memFactor),newsize);
    return;
  }
  if (-1 < newsize) {
    this->thesize = newsize;
    return;
  }
  this->thesize = 0;
  return;
}

Assistant:

void reSize(int newsize)
   {
      assert(memFactor >= 1);

      if(newsize > themax)
         reMax(int(memFactor * newsize), newsize);
      else if(newsize < 0)
         thesize = 0;
      else
         thesize = newsize;
   }